

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifier.c
# Opt level: O0

int flatcc_verify_struct_as_root(void *buf,size_t bufsiz,char *fid,size_t size,uint16_t align)

{
  int iVar1;
  flatbuffers_uoffset_t offset;
  uint16_t align_local;
  size_t size_local;
  char *fid_local;
  size_t bufsiz_local;
  void *buf_local;
  
  iVar1 = flatcc_verify_buffer_header(buf,bufsiz,fid);
  if (iVar1 == 0) {
    offset = read_uoffset(buf,0);
    buf_local._4_4_ =
         verify_struct((flatbuffers_uoffset_t)bufsiz,0,offset,(flatbuffers_uoffset_t)size,align);
  }
  else {
    buf_local._4_4_ = flatcc_verify_buffer_header(buf,bufsiz,fid);
  }
  return buf_local._4_4_;
}

Assistant:

int flatcc_verify_struct_as_root(const void *buf, size_t bufsiz, const char *fid, size_t size, uint16_t align)
{
    check_result(flatcc_verify_buffer_header(buf, bufsiz, fid));
    return verify_struct((uoffset_t)bufsiz, 0, read_uoffset(buf, 0), (uoffset_t)size, align);
}